

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O0

int __thiscall
pstore::sstring_view<const_char_*>::compare<char[1]>(sstring_view<const_char_*> *this,char (*s) [1])

{
  unsigned_long *puVar1;
  const_pointer __s1;
  czstring __s2;
  size_type sVar2;
  int local_4c;
  int local_34;
  size_type sStack_30;
  int result;
  unsigned_long local_28;
  size_type common_len;
  size_t slen;
  char (*s_local) [1];
  sstring_view<const_char_*> *this_local;
  
  slen = (size_t)s;
  s_local = (char (*) [1])this;
  common_len = string_traits<char[1]>::length(*s);
  sStack_30 = size(this);
  puVar1 = std::min<unsigned_long>(&stack0xffffffffffffffd0,&common_len);
  local_28 = *puVar1;
  __s1 = data(this);
  __s2 = string_traits<char[1]>::data((czstring)slen);
  local_34 = __gnu_cxx::char_traits<const_char>::compare(__s1,__s2,local_28);
  if (local_34 == 0) {
    sVar2 = size(this);
    if (sVar2 == common_len) {
      local_4c = 0;
    }
    else {
      sVar2 = size(this);
      local_4c = 1;
      if (sVar2 < common_len) {
        local_4c = -1;
      }
    }
    local_34 = local_4c;
  }
  return local_34;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }